

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_146826::BuildFileImpl::parseDefaultTarget(BuildFileImpl *this,ScalarNode *entry)

{
  StringRef Key;
  int iVar1;
  ScalarNode *in_RDX;
  bool bVar2;
  StringRef message;
  string target;
  string local_38;
  
  (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_(&local_38,entry,in_RDX);
  Key.Length = local_38._M_string_length;
  Key.Data = local_38._M_dataplus._M_p;
  iVar1 = llvm::StringMapImpl::FindKey(&(this->targets).super_StringMapImpl,Key);
  bVar2 = (long)iVar1 != (ulong)(this->targets).super_StringMapImpl.NumBuckets;
  if (bVar2 && iVar1 != -1) {
    std::__cxx11::string::_M_assign((string *)&this->defaultTarget);
    (*this->delegate->_vptr_BuildFileDelegate[10])
              (this->delegate,(this->defaultTarget)._M_dataplus._M_p,
               (this->defaultTarget)._M_string_length);
  }
  else {
    message.Length = 0x3d;
    message.Data = "invalid default target, a default target should be in targets";
    error(this,&entry->super_Node,message);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return bVar2 && iVar1 != -1;
}

Assistant:

bool parseDefaultTarget(llvm::yaml::ScalarNode* entry) {
    std::string target = stringFromScalarNode(entry);

    if (targets.find(target) == targets.end()) {
      error(entry, "invalid default target, a default target should be in targets");
      return false;
    }

    defaultTarget = target;
    delegate.loadedDefaultTarget(defaultTarget);

    return true;
  }